

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::Read<duckdb::vector<duckdb::PivotColumn,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  PivotColumn val;
  undefined1 local_a0 [48];
  vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_> local_70;
  _Alloc_hider local_58;
  char local_48 [16];
  __uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_> local_38;
  
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>).
  super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (*this->_vptr_Deserializer[8])(this);
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      PivotColumn::Deserialize((PivotColumn *)local_a0,this);
      (*this->_vptr_Deserializer[7])(this);
      ::std::vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>::
      emplace_back<duckdb::PivotColumn>
                (&__return_storage_ptr__->
                  super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>,
                 (PivotColumn *)local_a0);
      if ((_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
          local_38._M_t.
          super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
          super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl != (QueryNode *)0x0) {
        (**(code **)(*(long *)local_38._M_t.
                              super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                              .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl + 8))
                  ();
      }
      local_38._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           (tuple<duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)
           (_Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>)0x0;
      if (local_58._M_p != local_48) {
        operator_delete(local_58._M_p);
      }
      ::std::vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>::~vector
                (&local_70);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_a0 + 0x18));
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)local_a0);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}